

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

void __thiscall glslang::TInputScanner::advance(TInputScanner *this)

{
  bool bVar1;
  TInputScanner *this_local;
  
  this->currentChar = this->currentChar + 1;
  if (this->lengths[this->currentSource] <= this->currentChar) {
    this->currentSource = this->currentSource + 1;
    if (this->currentSource < this->numSources) {
      this->loc[this->currentSource].string = this->loc[this->currentSource + -1].string + 1;
      this->loc[this->currentSource].line = 1;
      this->loc[this->currentSource].column = 0;
    }
    while( true ) {
      bVar1 = false;
      if (this->currentSource < this->numSources) {
        bVar1 = this->lengths[this->currentSource] == 0;
      }
      if (!bVar1) break;
      this->currentSource = this->currentSource + 1;
      if (this->currentSource < this->numSources) {
        this->loc[this->currentSource].string = this->loc[this->currentSource + -1].string + 1;
        this->loc[this->currentSource].line = 1;
        this->loc[this->currentSource].column = 0;
      }
    }
    this->currentChar = 0;
  }
  return;
}

Assistant:

void advance()
    {
        ++currentChar;
        if (currentChar >= lengths[currentSource]) {
            ++currentSource;
            if (currentSource < numSources) {
                loc[currentSource].string = loc[currentSource - 1].string + 1;
                loc[currentSource].line = 1;
                loc[currentSource].column = 0;
            }
            while (currentSource < numSources && lengths[currentSource] == 0) {
                ++currentSource;
                if (currentSource < numSources) {
                    loc[currentSource].string = loc[currentSource - 1].string + 1;
                    loc[currentSource].line = 1;
                    loc[currentSource].column = 0;
                }
            }
            currentChar = 0;
        }
    }